

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int all_tests(void)

{
  int iVar1;
  
  iVar1 = test_foo();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_yatrie_get_word_nodes();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_yatrie_new();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_load_missed_file();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_int32_count();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_get();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_set();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_array_set();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_array_get();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_bit_count();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_char_bit_count();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_char_mask_get_bits_raised();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_char_mask_get_bits_raised_pre();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_trie_save_load();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_node_traverse_decode();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_decode_string();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_node_insert_ref();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_trie_get_id();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_node_traverse();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_trie_add();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_node_get_children();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_mask_get_bits_raised_pre();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_trie_char_add();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = test_transcode_string();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = complex_test();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  iVar1 = another_node_traverse();
  if (iVar1 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  return tests_failed;
}

Assistant:

static int all_tests() {
    U_RUN(test_foo);

    U_RUN(test_yatrie_get_word_nodes);
    U_RUN(test_yatrie_new);
    U_RUN(test_load_missed_file);
    U_RUN(test_bit_int32_count);
    U_RUN(test_bit_get);
    U_RUN(test_bit_set);
    U_RUN(test_bit_array_set);
    U_RUN(test_bit_array_get);
    U_RUN(test_bit_count);
    U_RUN(test_char_bit_count);
    U_RUN(test_char_mask_get_bits_raised);
    U_RUN(test_char_mask_get_bits_raised_pre);
    U_RUN(test_trie_save_load);
    U_RUN(test_node_traverse_decode);
    U_RUN(test_decode_string);
    U_RUN(test_node_insert_ref);
    U_RUN(test_trie_get_id);
    U_RUN(test_node_traverse);
    U_RUN(test_trie_add);
    U_RUN(test_node_get_children);
    U_RUN(test_mask_get_bits_raised_pre);
    U_RUN(test_trie_char_add);
    U_RUN(test_transcode_string);
    U_RUN(complex_test);
    U_RUN(another_node_traverse);

    return tests_failed;
}